

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TGAImage.cpp
# Opt level: O2

void __thiscall TRM::TGAImage::clearColor(TGAImage *this,TGAColor *c)

{
  size_t j;
  ulong uVar1;
  size_t i;
  ulong uVar2;
  
  for (uVar2 = 0; uVar2 < (ulong)(long)this->width; uVar2 = uVar2 + 1) {
    for (uVar1 = 0; uVar1 < (ulong)(long)this->height; uVar1 = uVar1 + 1) {
      set(this,(int)uVar2,(int)uVar1,c);
    }
  }
  return;
}

Assistant:

void TGAImage::clearColor(const TGAColor &c) {
  for (size_t i = 0; i < width; i++) {
    for (size_t j = 0; j < height; j++) {
      set(i, j, c);
    }
  }
}